

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::OnReturnCall(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  bool bVar1;
  Result RVar2;
  Label *local_38;
  Label *func_label;
  TypeVector *pTStack_28;
  Result result;
  TypeVector *result_types_local;
  TypeVector *param_types_local;
  TypeChecker *this_local;
  
  pTStack_28 = result_types;
  func_label._4_4_ = PopAndCheckSignature(this,param_types,"return_call");
  RVar2 = GetThisFunctionLabel(this,&local_38);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = CheckReturnSignature(this,pTStack_28,&local_38->result_types,"return_call");
    Result::operator|=((Result *)((long)&func_label + 4),RVar2);
    RVar2 = SetUnreachable(this);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      this_local._4_4_ = func_label._4_4_;
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnReturnCall(const TypeVector& param_types,
                                 const TypeVector& result_types) {
  Result result = PopAndCheckSignature(param_types, "return_call");
  Label* func_label;
  CHECK_RESULT(GetThisFunctionLabel(&func_label));
  result |= CheckReturnSignature(result_types, func_label->result_types,
                                 "return_call");

  CHECK_RESULT(SetUnreachable());
  return result;
}